

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_File_set_view
              (MPIABI_File fh,MPIABI_Offset disp,MPIABI_Datatype etype,MPIABI_Datatype filetype,
              char *datarep,MPIABI_Info info)

{
  int iVar1;
  
  iVar1 = MPI_File_set_view();
  return iVar1;
}

Assistant:

int MPIABI_File_set_view(
  MPIABI_File fh,
  MPIABI_Offset disp,
  MPIABI_Datatype etype,
  MPIABI_Datatype filetype,
  const char * datarep,
  MPIABI_Info info
) {
  return MPI_File_set_view(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)disp,
    (MPI_Datatype)(WPI_Datatype)etype,
    (MPI_Datatype)(WPI_Datatype)filetype,
    datarep,
    (MPI_Info)(WPI_Info)info
  );
}